

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O3

bool __thiscall
picojson::
input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::expect(input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this,int expected)

{
  uint uVar1;
  byte *pbVar2;
  
  skip_ws(this);
  pbVar2 = (byte *)(this->cur_)._M_current;
  if (this->consumed_ == true) {
    if (*pbVar2 == 10) {
      this->line_ = this->line_ + 1;
    }
    pbVar2 = pbVar2 + 1;
    (this->cur_)._M_current = (char *)pbVar2;
  }
  if (pbVar2 == (byte *)(this->end_)._M_current) {
    this->consumed_ = false;
    uVar1 = 0xffffffff;
  }
  else {
    this->consumed_ = true;
    uVar1 = (uint)*pbVar2;
  }
  if (uVar1 != expected) {
    this->consumed_ = false;
  }
  return uVar1 == expected;
}

Assistant:

bool expect(const int expected) {
    skip_ws();
    if (getc() != expected) {
      ungetc();
      return false;
    }
    return true;
  }